

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
          (cmExportFileGenerator *this,cmGeneratorTarget *target,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  mapped_type *this_02;
  allocator local_e1;
  key_type local_e0;
  allocator local_b9;
  string local_b8;
  undefined1 local_98 [8];
  string prepro;
  allocator local_61;
  string local_60;
  char *local_40;
  char *input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *pcStack_20;
  PreprocessContext preprocessRule_local;
  cmGeneratorTarget *target_local;
  cmExportFileGenerator *this_local;
  
  input = (char *)missingTargets;
  missingTargets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)properties;
  properties_local._4_4_ = preprocessRule;
  pcStack_20 = target;
  target_local = (cmGeneratorTarget *)this;
  bVar1 = cmGeneratorTarget::IsLinkable(target);
  this_01 = pcStack_20;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_60,"INTERFACE_LINK_LIBRARIES",&local_61);
    pcVar2 = cmGeneratorTarget::GetProperty(this_01,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    if (pcVar2 != (char *)0x0) {
      local_40 = pcVar2;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_b8,pcVar2,&local_b9);
      cmGeneratorExpression::Preprocess((string *)local_98,&local_b8,properties_local._4_4_,false);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      uVar3 = std::__cxx11::string::empty();
      bVar1 = (uVar3 & 1) == 0;
      if (bVar1) {
        ResolveTargetsInGeneratorExpressions
                  (this,(string *)local_98,pcStack_20,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)input,ReplaceFreeTargets);
        this_00 = missingTargets_local;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e0,"INTERFACE_LINK_LIBRARIES",&local_e1);
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)this_00,&local_e0);
        std::__cxx11::string::operator=((string *)this_02,(string *)local_98);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        this_local._7_1_ = 1;
      }
      std::__cxx11::string::~string((string *)local_98);
      if (bVar1) goto LAB_007195ac;
    }
    this_local._7_1_ = 0;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_007195ac:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty(
                      cmGeneratorTarget *target,
                      cmGeneratorExpression::PreprocessContext preprocessRule,
                      ImportPropertyMap &properties,
                      std::vector<std::string> &missingTargets)
{
  if(!target->IsLinkable())
    {
    return false;
    }
  const char *input = target->GetProperty("INTERFACE_LINK_LIBRARIES");
  if (input)
    {
    std::string prepro = cmGeneratorExpression::Preprocess(input,
                                                           preprocessRule);
    if (!prepro.empty())
      {
      this->ResolveTargetsInGeneratorExpressions(prepro, target,
                                                 missingTargets,
                                                 ReplaceFreeTargets);
      properties["INTERFACE_LINK_LIBRARIES"] = prepro;
      return true;
      }
    }
  return false;
}